

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O0

QByteArray * __thiscall QItemEditorFactory::valuePropertyName(QItemEditorFactory *this,int userType)

{
  long lVar1;
  QItemEditorCreatorBase *pQVar2;
  QItemEditorFactory *pQVar3;
  uint in_EDX;
  QItemEditorFactory *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QItemEditorFactory *dfactory;
  QItemEditorCreatorBase *creator;
  QItemEditorCreatorBase **in_stack_ffffffffffffffa8;
  QByteArray *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  pQVar2 = QHash<int,_QItemEditorCreatorBase_*>::value
                     ((QHash<int,_QItemEditorCreatorBase_*> *)in_RDI,(int *)in_RDI,
                      in_stack_ffffffffffffffa8);
  if (pQVar2 == (QItemEditorCreatorBase *)0x0) {
    pQVar3 = defaultFactory();
    if (pQVar3 == in_RSI) {
      QByteArray::QByteArray((QByteArray *)0x857327);
    }
    else {
      (*pQVar3->_vptr_QItemEditorFactory[3])(in_RDI,pQVar3,(ulong)in_EDX);
    }
  }
  else {
    (*pQVar2->_vptr_QItemEditorCreatorBase[3])(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QByteArray QItemEditorFactory::valuePropertyName(int userType) const
{
    QItemEditorCreatorBase *creator = creatorMap.value(userType, 0);
    if (!creator) {
        const QItemEditorFactory *dfactory = defaultFactory();
        return dfactory == this ? QByteArray() : dfactory->valuePropertyName(userType);
    }
    return creator->valuePropertyName();
}